

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  ulong uVar1;
  CleanupChunk *pCVar2;
  ulong uVar3;
  
  if (this->cleanup_ == (CleanupChunk *)0x0) {
    uVar3 = 8;
  }
  else {
    uVar1 = this->cleanup_->size * 2;
    uVar3 = 0x40;
    if (uVar1 < 0x40) {
      uVar3 = uVar1;
    }
  }
  pCVar2 = (CleanupChunk *)AllocateAligned(this,(ulong)((int)uVar3 * 0x10 + 0x17U & 0xff0));
  pCVar2->next = this->cleanup_;
  pCVar2->size = uVar3;
  this->cleanup_ = pCVar2;
  this->cleanup_ptr_ = pCVar2->nodes;
  this->cleanup_limit_ = pCVar2->nodes + uVar3;
  AddCleanup(this,elem,cleanup);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void SerialArena::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}